

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void hta::throw_exception<hta::Exception,char_const*,unsigned_long,char_const*>
               (char *args,unsigned_long args_1,char *args_2)

{
  Exception *this;
  string local_1d0;
  stringstream msg;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  detail::make_exception<const_char_*,_unsigned_long,_const_char_*>::operator()
            ((make_exception<const_char_*,_unsigned_long,_const_char_*> *)&local_1d0,&msg,args,
             args_1,args_2);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  Exception::Exception(this,&local_1d0);
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}